

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

void S_PrecacheLevel(void)

{
  ushort *puVar1;
  long lVar2;
  DThinker *pDVar3;
  ulong uVar4;
  FSoundChan *pFVar5;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator local_30;
  
  if (GSnd != (SoundRenderer *)0x0) {
    if (S_sfx.Count != 0) {
      lVar2 = 0x30;
      uVar4 = 0;
      do {
        puVar1 = (ushort *)((long)&((S_sfx.Array)->data).data + lVar2);
        *puVar1 = *puVar1 & 0xffdf;
        uVar4 = uVar4 + 1;
        lVar2 = lVar2 + 0x50;
      } while (uVar4 < S_sfx.Count);
    }
    FThinkerIterator::FThinkerIterator(&local_30,AActor::RegistrationInfo.MyClass,0x80);
    pDVar3 = FThinkerIterator::Next(&local_30,false);
    if (pDVar3 != (DThinker *)0x0) {
      do {
        (*(pDVar3->super_DObject)._vptr_DObject[0xc])(pDVar3);
        pDVar3 = FThinkerIterator::Next(&local_30,false);
      } while (pDVar3 != (DThinker *)0x0);
    }
    pFVar5 = Channels;
    if (((level.info)->PrecacheSounds).Count != 0) {
      uVar4 = 0;
      do {
        sfxinfo_t::MarkUsed(S_sfx.Array + ((level.info)->PrecacheSounds).Array[uVar4].ID);
        uVar4 = uVar4 + 1;
        pFVar5 = Channels;
      } while (uVar4 < ((level.info)->PrecacheSounds).Count);
    }
    for (; pFVar5 != (FSoundChan *)0x0; pFVar5 = pFVar5->NextChan) {
      sfxinfo_t::MarkUsed(S_sfx.Array + (pFVar5->SoundID).ID);
    }
    if (1 < S_sfx.Count) {
      uVar4 = 1;
      lVar2 = 0x50;
      do {
        if (((&(S_sfx.Array)->field_0x30)[lVar2] & 0x20) != 0) {
          S_CacheSound((sfxinfo_t *)((long)&((S_sfx.Array)->data).data + lVar2));
        }
        uVar4 = uVar4 + 1;
        lVar2 = lVar2 + 0x50;
      } while (uVar4 < S_sfx.Count);
    }
    if (1 < S_sfx.Count) {
      uVar4 = 1;
      lVar2 = 0x50;
      do {
        if ((((&(S_sfx.Array)->field_0x30)[lVar2] & 0x20) == 0) &&
           (*(int *)((long)&(S_sfx.Array)->link + lVar2) == -1)) {
          S_UnloadSound((sfxinfo_t *)((long)&((S_sfx.Array)->data).data + lVar2));
        }
        uVar4 = uVar4 + 1;
        lVar2 = lVar2 + 0x50;
      } while (uVar4 < S_sfx.Count);
    }
  }
  return;
}

Assistant:

void S_PrecacheLevel ()
{
	unsigned int i;

	if (GSnd)
	{
		for (i = 0; i < S_sfx.Size(); ++i)
		{
			S_sfx[i].bUsed = false;
		}

		AActor *actor;
		TThinkerIterator<AActor> iterator;

		// Precache all sounds known to be used by the currently spawned actors.
		while ( (actor = iterator.Next()) != NULL )
		{
			actor->MarkPrecacheSounds();
		}
		// Precache all extra sounds requested by this map.
		for (i = 0; i < level.info->PrecacheSounds.Size(); ++i)
		{
			level.info->PrecacheSounds[i].MarkUsed();
		}
		// Don't unload sounds that are playing right now.
		for (FSoundChan *chan = Channels; chan != NULL; chan = chan->NextChan)
		{
			chan->SoundID.MarkUsed();
		}

		for (i = 1; i < S_sfx.Size(); ++i)
		{
			if (S_sfx[i].bUsed)
			{
				S_CacheSound (&S_sfx[i]);
			}
		}
		for (i = 1; i < S_sfx.Size(); ++i)
		{
			if (!S_sfx[i].bUsed && S_sfx[i].link == sfxinfo_t::NO_LINK)
			{
				S_UnloadSound (&S_sfx[i]);
			}
		}
	}
}